

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2sc_name.c
# Opt level: O1

char * p2sc_name_swap_tmr(char *dir,guint8 *data,size_t len,guint64 o)

{
  bool bVar1;
  char *pcVar2;
  size_t sVar3;
  uint uVar4;
  char acrc [9];
  char local_21 [9];
  
  if (len == 0) {
    uVar4 = 0;
  }
  else {
    sVar3 = 0;
    uVar4 = 0;
    do {
      uVar4 = uVar4 << 8 ^ crc32table[(uint)data[sVar3] ^ uVar4 >> 0x18];
      sVar3 = sVar3 + 1;
    } while (len != sVar3);
  }
  if (len != 0) {
    do {
      uVar4 = uVar4 << 8 ^ crc32table[(uint)len & 0xff ^ uVar4 >> 0x18];
      bVar1 = 0xff < len;
      len = len >> 8;
    } while (bVar1);
  }
  sprintf(local_21,"%08x",(ulong)~uVar4);
  pcVar2 = ".";
  if (dir != (char *)0x0) {
    pcVar2 = dir;
  }
  pcVar2 = (char *)g_strdup_printf("%s/swap_%014lu_%s.fits",pcVar2,o,local_21);
  return pcVar2;
}

Assistant:

char *p2sc_name_swap_tmr(const char *dir, const guint8 *data, size_t len, guint64 o) {
    guint32 crc = p2sc_crc32_finalise(p2sc_crc32(0, data, len), len);
    char acrc[2 * sizeof crc + 1];

    sprintf(acrc, "%08x", crc);
    return g_strdup_printf("%s" DS "swap_" P_OBET_F "_%s.fits", DN(dir), o, acrc);
}